

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGEllipseElement::SVGEllipseElement(SVGEllipseElement *this,Document *document)

{
  SVGGeometryElement::SVGGeometryElement(&this->super_SVGGeometryElement,document,Ellipse);
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGEllipseElement_00154610;
  SVGLength::SVGLength(&this->m_cx,Cx,Horizontal,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_cy,Cy,Vertical,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_rx,Rx,Diagonal,Forbid,0.0,None);
  SVGLength::SVGLength(&this->m_ry,Ry,Diagonal,Forbid,0.0,None);
  SVGElement::addProperty((SVGElement *)this,&(this->m_cx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_cy).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_rx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_ry).super_SVGProperty);
  return;
}

Assistant:

SVGEllipseElement::SVGEllipseElement(Document* document)
    : SVGGeometryElement(document, ElementID::Ellipse)
    , m_cx(PropertyID::Cx, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_cy(PropertyID::Cy, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_rx(PropertyID::Rx, LengthDirection::Diagonal, LengthNegativeMode::Forbid)
    , m_ry(PropertyID::Ry, LengthDirection::Diagonal, LengthNegativeMode::Forbid)
{
    addProperty(m_cx);
    addProperty(m_cy);
    addProperty(m_rx);
    addProperty(m_ry);
}